

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# konvert.h
# Opt level: O1

double konvert::atof(char *__nptr)

{
  int *piVar1;
  ulong uVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 uVar15;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  
  uVar7 = (ulong)(*__nptr == '-');
  dVar8 = *(double *)(&DAT_00102030 + uVar7 * 8);
  piVar3 = (int *)(__nptr + uVar7 + 1);
  uVar2 = (long)__nptr[uVar7] - 0x30;
  if (uVar2 < 10) {
    uVar4 = *piVar3 + 0xcfcfcfd0;
    uVar5 = uVar4 & 0xff;
    if (uVar5 < 10) {
      piVar1 = (int *)(__nptr + uVar7 + 5);
      do {
        piVar3 = piVar1;
        uVar2 = (ulong)uVar5 + uVar2 * 10;
        uVar5 = uVar4 >> 8 & 0xff;
        if (9 < uVar5) {
          if (uVar5 != 0xfe) goto LAB_00101535;
          piVar3 = (int *)((long)piVar3 + -2);
          goto LAB_001013df;
        }
        uVar2 = (ulong)uVar5 + uVar2 * 10;
        uVar5 = uVar4 >> 0x10 & 0xff;
        if (9 < uVar5) {
          if (uVar5 != 0xfe) goto LAB_00101535;
          piVar3 = (int *)((long)piVar3 + -1);
          goto LAB_001013df;
        }
        uVar2 = (ulong)uVar5 + uVar2 * 10;
        if (0x9ffffff < uVar4) {
          if (uVar4 >> 0x18 != 0xfe) goto LAB_00101535;
          goto LAB_001013df;
        }
        uVar2 = (ulong)(uVar4 >> 0x18) + uVar2 * 10;
        uVar4 = *piVar3 + 0xcfcfcfd0;
        uVar5 = uVar4 & 0xff;
        piVar1 = piVar3 + 1;
      } while (uVar5 < 10);
    }
    if (uVar5 != 0xfe) {
LAB_00101535:
      auVar10._8_4_ = (int)(uVar2 >> 0x20);
      auVar10._0_8_ = uVar2;
      auVar10._12_4_ = 0x45300000;
      return dVar8 * ((auVar10._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
    }
    piVar3 = (int *)((long)piVar3 + 1);
  }
  else {
    if (uVar2 != 0xfffffffffffffffe) {
      dVar8 = nan("nan");
      return dVar8;
    }
    uVar2 = 0;
  }
LAB_001013df:
  uVar4 = *piVar3 + 0xcfcfcfd0;
  dVar12 = 0.0;
  uVar15 = (undefined4)(uVar2 >> 0x20);
  dVar9 = dVar8;
  if ((uVar4 & 0xfe) < 10) {
    lVar6 = 0;
    do {
      piVar3 = piVar3 + 1;
      lVar6 = (ulong)(uVar4 & 0xff) + lVar6 * 10;
      if (0x9ff < (uVar4 & 0xfe00)) {
        dVar9 = dVar9 * 0.1;
LAB_00101564:
        auVar14._8_4_ = (int)((ulong)lVar6 >> 0x20);
        auVar14._0_8_ = lVar6;
        auVar14._12_4_ = 0x45300000;
        auVar11._8_4_ = uVar15;
        auVar11._0_8_ = uVar2;
        auVar11._12_4_ = 0x45300000;
        return dVar8 * ((auVar11._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) +
               ((auVar14._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) * dVar9;
      }
      lVar6 = (ulong)(uVar4 >> 8 & 0xff) + lVar6 * 10;
      if (0x9ffff < (uVar4 & 0xfe0000)) {
        dVar9 = dVar9 * 0.01;
        goto LAB_00101564;
      }
      lVar6 = (ulong)(uVar4 >> 0x10 & 0xff) + lVar6 * 10;
      if (0x9ffffff < uVar4) {
        dVar9 = dVar9 * 0.001;
        goto LAB_00101564;
      }
      lVar6 = (ulong)(uVar4 >> 0x18) + lVar6 * 10;
      dVar9 = dVar9 * 0.0001;
      uVar4 = *piVar3 + 0xcfcfcfd0;
    } while ((uVar4 & 0xfe) < 10);
    auVar16._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar16._0_8_ = lVar6;
    auVar16._12_4_ = 0x45300000;
    dVar12 = (auVar16._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
  }
  auVar13._8_4_ = uVar15;
  auVar13._0_8_ = uVar2;
  auVar13._12_4_ = 0x45300000;
  return dVar8 * ((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) + dVar9 * dVar12;
}

Assistant:

inline double atof(const char *input){
    unsigned char rbuf[4];
    uint32_t *buf_ptr = (uint32_t *)rbuf;

    double frac = 1.0;
    if(*input == '-'){ frac = -1.0; input++; }

    unsigned long int_res = 0;
    unsigned long frac_res = 0;

    double sign = frac;
    uint32_t *input_ptr = (uint32_t *)(input + 1);

    if((int_res = (*input - '0')) <= 9) {
      while(true) {
        *buf_ptr = *input_ptr++ - 0x30303030;

        if( rbuf[0] <= 9 ) int_res = int_res*10 + rbuf[0];
        else if(rbuf[0] == 254) {input = ((char *)input_ptr - 3); break;}
        else return frac * int_res;

        if( rbuf[1] <= 9 ) int_res = int_res*10 + rbuf[1];
        else if(rbuf[1] == 254) {input = ((char *)input_ptr - 2); break;}
        else return frac * int_res;

        if( rbuf[2] <= 9 ) int_res = int_res*10 + rbuf[2];
        else if(rbuf[2] == 254) {input = ((char *)input_ptr - 1); break;}
        else return frac * int_res;

        if( rbuf[3] <= 9 ) int_res = int_res*10 + rbuf[3];
        else if(rbuf[3] == 254) {input = ((char *)input_ptr - 0); break;}
        else return frac * int_res;
      }
    }
    else if(int_res == (unsigned long)-2){ input++; int_res = 0; }
    else return nan("nan");


    input_ptr = (uint32_t *)(input);
    while(true){
      *buf_ptr = *input_ptr++ - 0x30303030;
      if( rbuf[0] <= 9 ) frac_res = frac_res*10 + rbuf[0]; else return (frac     * frac_res + int_res * sign);
      if( rbuf[1] <= 9 ) frac_res = frac_res*10 + rbuf[1]; else return (frac * .1 * frac_res + int_res * sign);
      if( rbuf[2] <= 9 ) frac_res = frac_res*10 + rbuf[2]; else return (frac * .01 * frac_res + int_res * sign);
      if( rbuf[3] <= 9 ) frac_res = frac_res*10 + rbuf[3]; else return (frac * .001 * frac_res + int_res * sign);
      frac *= .0001;
    }
  }